

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd_cgap.h
# Opt level: O0

void __thiscall
bwtil::bsd_cgap::build
          (bsd_cgap *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *gaps,bool last,
          cgap_dictionary *D)

{
  uint8_t uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  size_type sVar5;
  size_type in_RCX;
  byte in_DL;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  size_type *in_RDI;
  reference rVar6;
  ulint right;
  ulint left;
  uint j;
  ulint code_ul;
  uint l;
  vector<bool,_std::allocator<bool>_> code;
  ulint i_2;
  ulint cumulative_c;
  ulint cumulative_u;
  ulint i_1;
  ulint i;
  packed_view<std::vector> *in_stack_fffffffffffffe08;
  packed_view<std::vector> *in_stack_fffffffffffffe10;
  cgap_dictionary *in_stack_fffffffffffffe18;
  _Bit_type *in_stack_fffffffffffffe20;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  packed_view<std::vector> *in_stack_fffffffffffffe40;
  ulong uVar7;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference local_158;
  uint local_144;
  packed_view<std::vector> *local_140;
  uint local_134;
  reference local_108;
  reference local_f8;
  ulong local_e8;
  long local_e0;
  long local_d8;
  vector<bool,_std::allocator<bool>_> *local_60;
  ulong local_28;
  size_type local_20;
  byte local_11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_11 = in_DL & 1;
  *(undefined1 *)(in_RDI + 4) = 0x40;
  *in_RDI = in_RCX;
  if (local_11 != 0) {
    local_11 = 1;
  }
  local_20 = in_RCX;
  local_10 = in_RSI;
  if (local_11 == 0) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,sVar3 - 1);
    in_RDI[7] = *pvVar4;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    in_RDI[9] = sVar3 - 1;
  }
  else {
    in_RDI[7] = 0;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    in_RDI[9] = sVar3;
  }
  in_RDI[8] = in_RDI[7];
  local_28 = 0;
  while( true ) {
    uVar7 = local_28;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    if ((sVar3 - 1) + (ulong)(local_11 & 1) <= uVar7) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,local_28);
    in_RDI[8] = *pvVar4 + in_RDI[8];
    local_28 = local_28 + 1;
  }
  uVar1 = intlog2(in_RDI[8]);
  *(uint8_t *)((long)in_RDI + 0x31) = uVar1;
  *(uint *)(in_RDI + 10) = (uint)*(byte *)((long)in_RDI + 0x31) * 5;
  if ((uint)in_RDI[10] < 2) {
    *(undefined4 *)(in_RDI + 10) = 2;
  }
  in_RDI[0xb] = in_RDI[9] / (ulong)(uint)in_RDI[10] +
                (ulong)(in_RDI[9] % (ulong)(uint)in_RDI[10] != 0);
  bv::internal::packed_view<std::vector>::packed_view
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
  bv::internal::packed_view<std::vector>::operator=
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x136841);
  in_RDI[5] = 0;
  local_60 = (vector<bool,_std::allocator<bool>_> *)0x0;
  while( true ) {
    this_00 = local_60;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    if ((vector<bool,_std::allocator<bool>_> *)((sVar3 - 1) + (ulong)(local_11 & 1)) <= this_00)
    break;
    if ((ulong)local_60 % (ulong)(uint)in_RDI[10] != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (local_10,(size_type)local_60);
      cgap_dictionary::encode(in_stack_fffffffffffffe18,(ulint)in_stack_fffffffffffffe10);
      sVar3 = std::vector<bool,_std::allocator<bool>_>::size(this_00);
      in_RDI[5] = sVar3 + in_RDI[5];
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x136915);
    }
    local_60 = (vector<bool,_std::allocator<bool>_> *)
               ((long)&(local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
  }
  bv::internal::bitview<std::vector>::bitview<unsigned_long,void>
            (&in_stack_fffffffffffffe40->_bits,in_stack_fffffffffffffe38);
  bv::internal::bitview<std::vector>::operator=
            (&in_stack_fffffffffffffe10->_bits,&in_stack_fffffffffffffe08->_bits);
  bv::internal::bitview<std::vector>::~bitview((bitview<std::vector> *)0x136969);
  uVar1 = intlog2(in_RDI[5]);
  *(uint8_t *)(in_RDI + 6) = uVar1;
  bv::internal::packed_view<std::vector>::packed_view
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
  bv::internal::packed_view<std::vector>::operator=
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x1369be);
  rVar6._M_mask = (_Bit_type)in_stack_fffffffffffffe18;
  rVar6._M_p = in_stack_fffffffffffffe20;
  local_d8 = 0;
  local_e0 = 0;
  local_e8 = 0;
  while( true ) {
    uVar7 = local_e8;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    if ((sVar3 - 1) + (ulong)(local_11 & 1) <= uVar7) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,local_e8);
    local_d8 = *pvVar4 + local_d8;
    if (local_e8 % (ulong)(uint)in_RDI[10] == 0) {
      in_stack_fffffffffffffe30 = (vector<bool,_std::allocator<bool>_> *)(local_d8 - 1);
      local_f8 = bv::internal::packed_view<std::vector>::operator[]
                           (in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)
                 in_stack_fffffffffffffe10,(value_type)in_stack_fffffffffffffe08);
      local_108 = bv::internal::packed_view<std::vector>::operator[]
                            (in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08);
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                ((item_reference<bv::internal::packed_view<std::vector>_> *)
                 in_stack_fffffffffffffe10,(value_type)in_stack_fffffffffffffe08);
    }
    else {
      sVar3 = local_20;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_10,local_e8);
      cgap_dictionary::encode((cgap_dictionary *)rVar6._M_mask,(ulint)in_stack_fffffffffffffe10);
      sVar5 = std::vector<bool,_std::allocator<bool>_>::size(this_00);
      local_134 = (uint)sVar5;
      local_140 = (packed_view<std::vector> *)0x0;
      for (local_144 = 0; local_144 < local_134; local_144 = local_144 + 1) {
        in_stack_fffffffffffffe10 = (packed_view<std::vector> *)((long)local_140 * 2);
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe30,sVar3);
        local_158 = rVar6;
        bVar2 = ::std::_Bit_reference::operator_cast_to_bool(&local_158);
        local_140 = (packed_view<std::vector> *)
                    ((long)&(in_stack_fffffffffffffe10->_bits)._container.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + (ulong)bVar2);
      }
      in_stack_fffffffffffffe08 = local_140;
      bv::internal::bitview<std::vector>::operator()
                ((bitview<std::vector> *)rVar6._M_p,rVar6._M_mask,(size_t)in_stack_fffffffffffffe10)
      ;
      bv::internal::range_reference<bv::internal::bitview<std::vector>_>::operator=
                ((range_reference<bv::internal::bitview<std::vector>_> *)in_stack_fffffffffffffe10,
                 (word_type)in_stack_fffffffffffffe08);
      local_e0 = (ulong)local_134 + local_e0;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x136cda);
    }
    local_e8 = local_e8 + 1;
  }
  return;
}

Assistant:

void build(vector<ulint> &gaps,bool last, cgap_dictionary * D){

		assert(gaps.size()>0);

		W = sizeof(ulint)*8;

		this->D=D;
		if(last) last=1;

		if(last){

			tail=0;
			n=gaps.size();

		}else{

			tail=gaps[gaps.size()-1];
			n=gaps.size()-1;

		}

		//cout << "n = " << (ulint)n<<endl;

		u = tail;

		//count bits and ones
		for(ulint i=0;i<(gaps.size()-1)+last;++i)
			u+=gaps[i];

		assert(u>0);

		//cout << "u = " << (ulint)u<<endl;

		logu = intlog2(u);

		//compute block size
		t = 5*logu;
		if(t<2) t = 2;

		number_of_blocks = n/t + (n%t!=0);
		first_el = packed_view<vector>(logu,number_of_blocks);

		c=0;

		//count number of bits in C
		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			if(i%t!=0)
				c+=D->encode(gaps[i]).size();

		}

		C = bitview<vector>(c);
		logc = intlog2(c);

		//cout << "log c = " << (ulint)logc<<endl;
		//cout << "log u = " << (ulint)logu<<endl;
		//cout << "t = " << (ulint)t<<endl;

		C_addr = packed_view<vector>(logc,number_of_blocks);

		ulint cumulative_u = 0;
		ulint cumulative_c = 0;

		for(ulint i=0;i<(gaps.size()-1)+last;++i){

			cumulative_u+=gaps[i];

			if(i%t==0){

				assert(cumulative_u>0);
				assert(cumulative_u-1<(ulint(1)<<logu));
				assert(cumulative_c<(ulint(1)<<logc));

				first_el[i/t] = cumulative_u-1;
				C_addr[i/t] = cumulative_c;

			}else{

				auto code = D->encode(gaps[i]);
				uint l = code.size();

				ulint code_ul=0;

				for(uint j=0;j<l;j++)
					code_ul = code_ul*2+code[j];

				assert(code_ul<(ulint(1)<<l));

				//transform to access correctly C:
				//interval [i,i+l) -> [(c-i)-l,c-i)

				assert(c>=(cumulative_c+l));
				ulint left = (c - cumulative_c)-l;
				ulint right = c - cumulative_c;

				C(left,right) = code_ul;

				cumulative_c+=l;

			}

		}

		//cout << "c = " << (ulint)c<<endl;

		/*cout << "first el : "<<endl;
		for(auto i : first_el)
			cout << i << endl;*/

	}